

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char local_78 [8];
  char msg [40];
  dtl_dv_t *extension_config;
  dtl_sv_t *svShutdownTimer;
  dtl_hv_t *serverCfg;
  _Bool ok;
  long lStack_30;
  int32_t i32;
  dtl_dv_t *tmp;
  dtl_hv_t *server_config;
  char **ppcStack_18;
  apx_error_t result;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  tmp = (dtl_dv_t *)0x0;
  m_shutdownTimer = 10;
  m_runFlag = 1;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if ((uint)argc < 2) {
    printUsage(*argv);
    argv_local._4_4_ = 0;
  }
  else {
    printf("APX Server %s\n\n",SW_VERSION_STR);
    server_config._4_4_ = load_config_file(ppcStack_18[1],(dtl_hv_t **)&tmp);
    printf("Loading %s: ",ppcStack_18[1]);
    if (server_config._4_4_ == 0) {
      printf("OK\n");
      lStack_30 = dtl_hv_get_cstr(tmp,"server");
      if ((((lStack_30 != 0) && (iVar1 = dtl_dv_type(lStack_30), iVar1 == 4)) &&
          (lVar2 = dtl_hv_get_cstr(lStack_30,"shutdown-timer"), lVar2 != 0)) &&
         (serverCfg._4_4_ = dtl_sv_to_i32(lVar2,(long)&serverCfg + 3), (serverCfg._3_1_ & 1) != 0))
      {
        m_shutdownTimer = serverCfg._4_4_;
      }
      signal_handler_setup();
      apx_server_create(&m_server);
      if (tmp != (dtl_dv_t *)0x0) {
        msg[0x20] = '\0';
        msg[0x21] = '\0';
        msg[0x22] = '\0';
        msg[0x23] = '\0';
        msg[0x24] = '\0';
        msg[0x25] = '\0';
        msg[0x26] = '\0';
        msg[0x27] = '\0';
        msg._32_8_ = dtl_hv_get_cstr(tmp,"extension");
        if ((msg._32_8_ != 0) && (iVar1 = dtl_dv_type(msg._32_8_), iVar1 == 4)) {
          register_apx_server_extensions(&m_server,(dtl_hv_t *)msg._32_8_);
        }
      }
      apx_server_start(&m_server);
      while (m_runFlag != 0) {
        usleep(1000000);
        if (0 < m_shutdownTimer) {
          m_shutdownTimer = m_shutdownTimer - 1;
          if (m_shutdownTimer == 0) break;
          if (m_shutdownTimer < 10) {
            sprintf(local_78,"Shutdown in %ds",(ulong)(uint)m_shutdownTimer);
            apx_server_log_event(&m_server,3,"main",local_78);
          }
        }
      }
      printf("Server shutdown started\n");
      apx_server_destroy(&m_server);
      dtl_dv_dec_ref(tmp);
      printf("Server shutdown complete\n");
      argv_local._4_4_ = 0;
    }
    else {
      printf("Error %d\n",(ulong)server_config._4_4_);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
   apx_error_t result;
   dtl_hv_t *server_config = (dtl_hv_t*) 0;

   m_shutdownTimer = SHUTDOWN_TIMER_INIT;   
   m_runFlag = 1;

   if (argc < 2u)
   {
      printUsage(argv[0]);
      return 0;
   }
   printf("APX Server %s\n\n", SW_VERSION_STR);
   result = load_config_file(argv[1], &server_config);
   printf("Loading %s: ", argv[1]);
   if (result != APX_NO_ERROR)
   {
      printf("Error %d\n", (int) result);
      return 1;
   }
   else
   {
      printf("OK\n");
      dtl_dv_t *tmp = dtl_hv_get_cstr(server_config, "server");
      if ( (tmp != 0) && (dtl_dv_type(tmp) == DTL_DV_HASH) )
      {
         int32_t i32;
         bool ok;
         dtl_hv_t *serverCfg = (dtl_hv_t*) tmp;
         dtl_sv_t *svShutdownTimer = (dtl_sv_t*) dtl_hv_get_cstr(serverCfg, "shutdown-timer");
         if (svShutdownTimer != 0)
         {
            i32 = dtl_sv_to_i32(svShutdownTimer, &ok);
            if (ok)
            {
               m_shutdownTimer = i32;
            }
         }
      }
   }

#ifdef _WIN32
   if (init_wsa() != 0)
   {
      int err = WSAGetLastError();
      fprintf(stderr, "WSAStartup failed with error: %d\n", err);
      return 1;
   }
#else
   signal_handler_setup();
#endif
   apx_server_create(&m_server);
   if (server_config != 0)
   {
      dtl_dv_t *extension_config = (dtl_dv_t*) 0;
      extension_config = dtl_hv_get_cstr(server_config, "extension");
      if ( (extension_config != 0) && (dtl_dv_type(extension_config) == DTL_DV_HASH) )
      {
         register_apx_server_extensions(&m_server, (dtl_hv_t*) extension_config);
      }
   }
   apx_server_start(&m_server);
   while(m_runFlag != 0)
   {
      SLEEP(1000); //main thread is sleeping while child threads do all the work
      if (m_shutdownTimer > 0)
      {
         if (--m_shutdownTimer==0) //this counter is used during a cleanup test to verify that all resources are properly cleaned up
         {
            break;
         }
         if (m_shutdownTimer < SHUTDOWN_TIMER_WARN_THRESHOLD)
         {
            char msg[40];
            sprintf(msg, "Shutdown in %ds", m_shutdownTimer);
            apx_server_log_event(&m_server, APX_LOG_LEVEL_INFO, "main", msg);
         }
      }
   }
   printf("Server shutdown started\n");
   apx_server_destroy(&m_server);
   dtl_dec_ref(server_config);
   printf("Server shutdown complete\n");
#ifdef _WIN32
   WSACleanup();
#endif
#if defined(_MSC_VER) && (CLEANUP_TEST != 0)
   _CrtDumpMemoryLeaks();
#endif
   return 0;
}